

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_sse4.h
# Opt level: O0

__m128i blend_8(uint8_t *src0,uint8_t *src1,__m128i *v_m0_w,__m128i *v_m1_w)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  void *in_RSI;
  void *pvVar3;
  void *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  __m128i alVar4;
  __m128i v_val_w;
  __m128i v_res_w;
  __m128i v_sum_w;
  __m128i v_p1_w;
  __m128i v_p0_w;
  __m128i v_s1_w;
  __m128i v_s0_w;
  __m128i v_s1_b;
  __m128i v_s0_b;
  
  pvVar3 = in_RSI;
  xx_loadl_64(in_RDI);
  alVar4 = xx_loadl_64(in_RSI);
  auVar2._8_8_ = extraout_XMM0_Qb;
  auVar2._0_8_ = extraout_XMM0_Qa;
  pmovzxbw(auVar2,extraout_XMM0_Qa);
  auVar1._8_8_ = extraout_XMM0_Qb_00;
  auVar1._0_8_ = extraout_XMM0_Qa_00;
  pmovzxbw(auVar1,extraout_XMM0_Qa_00);
  v_val_w[1] = (longlong)pvVar3;
  v_val_w[0] = 6;
  alVar4 = xx_roundn_epu16(v_val_w,(int)alVar4[1]);
  alVar4[0] = alVar4[0];
  alVar4[1] = alVar4[1];
  return alVar4;
}

Assistant:

static inline __m128i blend_8(const uint8_t *src0, const uint8_t *src1,
                              const __m128i *v_m0_w, const __m128i *v_m1_w) {
  const __m128i v_s0_b = xx_loadl_64(src0);
  const __m128i v_s1_b = xx_loadl_64(src1);
  const __m128i v_s0_w = _mm_cvtepu8_epi16(v_s0_b);
  const __m128i v_s1_w = _mm_cvtepu8_epi16(v_s1_b);

  const __m128i v_p0_w = _mm_mullo_epi16(v_s0_w, *v_m0_w);
  const __m128i v_p1_w = _mm_mullo_epi16(v_s1_w, *v_m1_w);

  const __m128i v_sum_w = _mm_add_epi16(v_p0_w, v_p1_w);

  const __m128i v_res_w = xx_roundn_epu16(v_sum_w, AOM_BLEND_A64_ROUND_BITS);

  return v_res_w;
}